

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall jsonnet::internal::CompilerPass::visitExpr(CompilerPass *this,AST **ast_)

{
  ostream *this_00;
  void *this_01;
  long *in_RSI;
  long *in_RDI;
  Var *ast_29;
  Unary *ast_28;
  SuperIndex *ast_27;
  Self *ast_26;
  Parens *ast_25;
  ObjectComprehensionSimple *ast_24;
  ObjectComprehension *ast_23;
  Object *ast_22;
  Local *ast_21;
  LiteralString *ast_20;
  LiteralNumber *ast_19;
  LiteralNull *ast_18;
  LiteralBoolean *ast_17;
  InSuper *ast_16;
  Index *ast_15;
  Importbin *ast_14;
  Importstr *ast_13;
  Import *ast_12;
  Function *ast_11;
  Error *ast_10;
  Dollar *ast_9;
  DesugaredObject *ast_8;
  Conditional *ast_7;
  BuiltinFunction *ast_6;
  Binary *ast_5;
  Assert *ast_4;
  ArrayComprehension *ast_3;
  Array *ast_2;
  ApplyBrace *ast_1;
  Apply *ast;
  long local_2f0;
  long local_2e0;
  long local_2d0;
  long local_2c0;
  long local_2b0;
  long local_2a0;
  long local_290;
  long local_280;
  long local_270;
  long local_260;
  long local_250;
  long local_240;
  long local_230;
  long local_220;
  long local_210;
  long local_200;
  long local_1f0;
  long local_1e0;
  long local_1d0;
  long local_1c0;
  long local_1b0;
  long local_1a0;
  long local_190;
  long local_180;
  long local_170;
  long local_160;
  long local_150;
  long local_140;
  long local_130;
  long local_120;
  
  switch(*(undefined4 *)(*in_RSI + 0x48)) {
  case 0:
    if (*in_RSI == 0) {
      local_120 = 0;
    }
    else {
      local_120 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Apply::typeinfo,0);
    }
    if (local_120 == 0) {
      __assert_fail("dynamic_cast<Apply *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x12e,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x38))(in_RDI,*in_RSI);
    break;
  case 1:
    if (*in_RSI == 0) {
      local_130 = 0;
    }
    else {
      local_130 = __dynamic_cast(*in_RSI,&AST::typeinfo,&ApplyBrace::typeinfo,0);
    }
    if (local_130 == 0) {
      __assert_fail("dynamic_cast<ApplyBrace *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x12f,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x40))(in_RDI,*in_RSI);
    break;
  case 2:
    if (*in_RSI == 0) {
      local_140 = 0;
    }
    else {
      local_140 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Array::typeinfo,0);
    }
    if (local_140 == 0) {
      __assert_fail("dynamic_cast<Array *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x130,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x48))(in_RDI,*in_RSI);
    break;
  case 3:
    if (*in_RSI == 0) {
      local_150 = 0;
    }
    else {
      local_150 = __dynamic_cast(*in_RSI,&AST::typeinfo,&ArrayComprehension::typeinfo,0);
    }
    if (local_150 == 0) {
      __assert_fail("dynamic_cast<ArrayComprehension *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x131,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x50))(in_RDI,*in_RSI);
    break;
  default:
    this_00 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown AST: ");
    this_01 = (void *)std::ostream::operator<<(this_00,(void *)*in_RSI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    abort();
  case 5:
    if (*in_RSI == 0) {
      local_160 = 0;
    }
    else {
      local_160 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Assert::typeinfo,0);
    }
    if (local_160 == 0) {
      __assert_fail("dynamic_cast<Assert *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x133,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x58))(in_RDI,*in_RSI);
    break;
  case 6:
    if (*in_RSI == 0) {
      local_170 = 0;
    }
    else {
      local_170 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Binary::typeinfo,0);
    }
    if (local_170 == 0) {
      __assert_fail("dynamic_cast<Binary *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x134,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x60))(in_RDI,*in_RSI);
    break;
  case 7:
    if (*in_RSI == 0) {
      local_180 = 0;
    }
    else {
      local_180 = __dynamic_cast(*in_RSI,&AST::typeinfo,&BuiltinFunction::typeinfo,0);
    }
    if (local_180 == 0) {
      __assert_fail("dynamic_cast<BuiltinFunction *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x135,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x68))(in_RDI,*in_RSI);
    break;
  case 8:
    if (*in_RSI == 0) {
      local_190 = 0;
    }
    else {
      local_190 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Conditional::typeinfo,0);
    }
    if (local_190 == 0) {
      __assert_fail("dynamic_cast<Conditional *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x136,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x70))(in_RDI,*in_RSI);
    break;
  case 9:
    if (*in_RSI == 0) {
      local_1a0 = 0;
    }
    else {
      local_1a0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&DesugaredObject::typeinfo,0);
    }
    if (local_1a0 == 0) {
      __assert_fail("dynamic_cast<DesugaredObject *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x137,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0xe8))(in_RDI,*in_RSI);
    break;
  case 10:
    if (*in_RSI == 0) {
      local_1b0 = 0;
    }
    else {
      local_1b0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Dollar::typeinfo,0);
    }
    if (local_1b0 == 0) {
      __assert_fail("dynamic_cast<Dollar *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x138,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x78))(in_RDI,*in_RSI);
    break;
  case 0xb:
    if (*in_RSI == 0) {
      local_1c0 = 0;
    }
    else {
      local_1c0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Error::typeinfo,0);
    }
    if (local_1c0 == 0) {
      __assert_fail("dynamic_cast<Error *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x139,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x80))(in_RDI,*in_RSI);
    break;
  case 0xc:
    if (*in_RSI == 0) {
      local_1d0 = 0;
    }
    else {
      local_1d0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Function::typeinfo,0);
    }
    if (local_1d0 == 0) {
      __assert_fail("dynamic_cast<Function *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x13a,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x88))(in_RDI,*in_RSI);
    break;
  case 0xd:
    if (*in_RSI == 0) {
      local_1e0 = 0;
    }
    else {
      local_1e0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Import::typeinfo,0);
    }
    if (local_1e0 == 0) {
      __assert_fail("dynamic_cast<Import *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x13b,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x90))(in_RDI,*in_RSI);
    break;
  case 0xe:
    if (*in_RSI == 0) {
      local_1f0 = 0;
    }
    else {
      local_1f0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Importstr::typeinfo,0);
    }
    if (local_1f0 == 0) {
      __assert_fail("dynamic_cast<Importstr *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x13c,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x98))(in_RDI,*in_RSI);
    break;
  case 0xf:
    if (*in_RSI == 0) {
      local_200 = 0;
    }
    else {
      local_200 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Importbin::typeinfo,0);
    }
    if (local_200 == 0) {
      __assert_fail("dynamic_cast<Importbin *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x13d,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0xa0))(in_RDI,*in_RSI);
    break;
  case 0x10:
    if (*in_RSI == 0) {
      local_210 = 0;
    }
    else {
      local_210 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Index::typeinfo,0);
    }
    if (local_210 == 0) {
      __assert_fail("dynamic_cast<Index *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x13e,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0xb0))(in_RDI,*in_RSI);
    break;
  case 0x11:
    if (*in_RSI == 0) {
      local_220 = 0;
    }
    else {
      local_220 = __dynamic_cast(*in_RSI,&AST::typeinfo,&InSuper::typeinfo,0);
    }
    if (local_220 == 0) {
      __assert_fail("dynamic_cast<InSuper *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x13f,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0xa8))(in_RDI,*in_RSI);
    break;
  case 0x12:
    if (*in_RSI == 0) {
      local_230 = 0;
    }
    else {
      local_230 = __dynamic_cast(*in_RSI,&AST::typeinfo,&LiteralBoolean::typeinfo,0);
    }
    if (local_230 == 0) {
      __assert_fail("dynamic_cast<LiteralBoolean *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x140,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0xc0))(in_RDI,*in_RSI);
    break;
  case 0x13:
    if (*in_RSI == 0) {
      local_240 = 0;
    }
    else {
      local_240 = __dynamic_cast(*in_RSI,&AST::typeinfo,&LiteralNull::typeinfo,0);
    }
    if (local_240 == 0) {
      __assert_fail("dynamic_cast<LiteralNull *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x141,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0xd8))(in_RDI,*in_RSI);
    break;
  case 0x14:
    if (*in_RSI == 0) {
      local_250 = 0;
    }
    else {
      local_250 = __dynamic_cast(*in_RSI,&AST::typeinfo,&LiteralNumber::typeinfo,0);
    }
    if (local_250 == 0) {
      __assert_fail("dynamic_cast<LiteralNumber *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x142,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 200))(in_RDI,*in_RSI);
    break;
  case 0x15:
    if (*in_RSI == 0) {
      local_260 = 0;
    }
    else {
      local_260 = __dynamic_cast(*in_RSI,&AST::typeinfo,&LiteralString::typeinfo,0);
    }
    if (local_260 == 0) {
      __assert_fail("dynamic_cast<LiteralString *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x143,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0xd0))(in_RDI,*in_RSI);
    break;
  case 0x16:
    if (*in_RSI == 0) {
      local_270 = 0;
    }
    else {
      local_270 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Local::typeinfo,0);
    }
    if (local_270 == 0) {
      __assert_fail("dynamic_cast<Local *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x144,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0xb8))(in_RDI,*in_RSI);
    break;
  case 0x17:
    if (*in_RSI == 0) {
      local_280 = 0;
    }
    else {
      local_280 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Object::typeinfo,0);
    }
    if (local_280 == 0) {
      __assert_fail("dynamic_cast<Object *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x145,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0xe0))(in_RDI,*in_RSI);
    break;
  case 0x18:
    if (*in_RSI == 0) {
      local_290 = 0;
    }
    else {
      local_290 = __dynamic_cast(*in_RSI,&AST::typeinfo,&ObjectComprehension::typeinfo,0);
    }
    if (local_290 == 0) {
      __assert_fail("dynamic_cast<ObjectComprehension *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x146,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0xf0))(in_RDI,*in_RSI);
    break;
  case 0x19:
    if (*in_RSI == 0) {
      local_2a0 = 0;
    }
    else {
      local_2a0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&ObjectComprehensionSimple::typeinfo,0);
    }
    if (local_2a0 == 0) {
      __assert_fail("dynamic_cast<ObjectComprehensionSimple *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x147,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0xf8))(in_RDI,*in_RSI);
    break;
  case 0x1a:
    if (*in_RSI == 0) {
      local_2b0 = 0;
    }
    else {
      local_2b0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Parens::typeinfo,0);
    }
    if (local_2b0 == 0) {
      __assert_fail("dynamic_cast<Parens *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x148,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x100))(in_RDI,*in_RSI);
    break;
  case 0x1b:
    if (*in_RSI == 0) {
      local_2c0 = 0;
    }
    else {
      local_2c0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Self::typeinfo,0);
    }
    if (local_2c0 == 0) {
      __assert_fail("dynamic_cast<Self *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x149,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x108))(in_RDI,*in_RSI);
    break;
  case 0x1c:
    if (*in_RSI == 0) {
      local_2d0 = 0;
    }
    else {
      local_2d0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&SuperIndex::typeinfo,0);
    }
    if (local_2d0 == 0) {
      __assert_fail("dynamic_cast<SuperIndex *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x14a,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x110))(in_RDI,*in_RSI);
    break;
  case 0x1d:
    if (*in_RSI == 0) {
      local_2e0 = 0;
    }
    else {
      local_2e0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Unary::typeinfo,0);
    }
    if (local_2e0 == 0) {
      __assert_fail("dynamic_cast<Unary *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x14b,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x118))(in_RDI,*in_RSI);
    break;
  case 0x1e:
    if (*in_RSI == 0) {
      local_2f0 = 0;
    }
    else {
      local_2f0 = __dynamic_cast(*in_RSI,&AST::typeinfo,&Var::typeinfo,0);
    }
    if (local_2f0 == 0) {
      __assert_fail("dynamic_cast<Var *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/pass.cpp"
                    ,0x14c,"virtual void jsonnet::internal::CompilerPass::visitExpr(AST *&)");
    }
    (**(code **)(*in_RDI + 0x120))(in_RDI,*in_RSI);
  }
  return;
}

Assistant:

void CompilerPass::visitExpr(AST *&ast_)
{
    switch(ast_->type) {
        VISIT(ast_, AST_APPLY, Apply);
        VISIT(ast_, AST_APPLY_BRACE, ApplyBrace);
        VISIT(ast_, AST_ARRAY, Array);
        VISIT(ast_, AST_ARRAY_COMPREHENSION, ArrayComprehension);
        // VISIT(ast_, AST_ARRAY_COMPREHENSION, ArrayComprehensionSimple);
        VISIT(ast_, AST_ASSERT, Assert);
        VISIT(ast_, AST_BINARY, Binary);
        VISIT(ast_, AST_BUILTIN_FUNCTION, BuiltinFunction);
        VISIT(ast_, AST_CONDITIONAL, Conditional);
        VISIT(ast_, AST_DESUGARED_OBJECT, DesugaredObject);
        VISIT(ast_, AST_DOLLAR, Dollar);
        VISIT(ast_, AST_ERROR, Error);
        VISIT(ast_, AST_FUNCTION, Function);
        VISIT(ast_, AST_IMPORT, Import);
        VISIT(ast_, AST_IMPORTSTR, Importstr);
        VISIT(ast_, AST_IMPORTBIN, Importbin);
        VISIT(ast_, AST_INDEX, Index);
        VISIT(ast_, AST_IN_SUPER, InSuper);
        VISIT(ast_, AST_LITERAL_BOOLEAN, LiteralBoolean);
        VISIT(ast_, AST_LITERAL_NULL, LiteralNull);
        VISIT(ast_, AST_LITERAL_NUMBER, LiteralNumber);
        VISIT(ast_, AST_LITERAL_STRING, LiteralString);
        VISIT(ast_, AST_LOCAL, Local);
        VISIT(ast_, AST_OBJECT, Object);
        VISIT(ast_, AST_OBJECT_COMPREHENSION, ObjectComprehension);
        VISIT(ast_, AST_OBJECT_COMPREHENSION_SIMPLE, ObjectComprehensionSimple);
        VISIT(ast_, AST_PARENS, Parens);
        VISIT(ast_, AST_SELF, Self);
        VISIT(ast_, AST_SUPER_INDEX, SuperIndex);
        VISIT(ast_, AST_UNARY, Unary);
        VISIT(ast_, AST_VAR, Var);
        default:
            std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
            std::abort();
            break;
    }
}